

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# o3dgcBinaryStream.h
# Opt level: O0

unsigned_long __thiscall
o3dgc::BinaryStream::ReadUInt32ASCII(BinaryStream *this,unsigned_long *position)

{
  ulong uVar1;
  unsigned_long uVar2;
  byte *pbVar3;
  ulong local_30;
  unsigned_long i;
  unsigned_long shift;
  unsigned_long value;
  unsigned_long *position_local;
  BinaryStream *this_local;
  
  uVar1 = *position;
  uVar2 = Vector<unsigned_char>::GetSize(&this->m_stream);
  if (uVar1 < uVar2 - 5) {
    shift = 0;
    i = 0;
    for (local_30 = 0; local_30 < 5; local_30 = local_30 + 1) {
      uVar2 = *position;
      *position = uVar2 + 1;
      pbVar3 = Vector<unsigned_char>::operator[](&this->m_stream,uVar2);
      shift = (long)(int)((uint)*pbVar3 << ((byte)i & 0x1f)) + shift;
      i = i + 7;
    }
    return shift;
  }
  __assert_fail("position < m_stream.GetSize() - O3DGC_BINARY_STREAM_NUM_SYMBOLS_UINT32",
                "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/../contrib/Open3DGC/o3dgcBinaryStream.h"
                ,0x145,"unsigned long o3dgc::BinaryStream::ReadUInt32ASCII(unsigned long &) const");
}

Assistant:

unsigned long           ReadUInt32ASCII(unsigned long & position)  const
                                {
                                    assert(position < m_stream.GetSize() - O3DGC_BINARY_STREAM_NUM_SYMBOLS_UINT32);
                                    unsigned long value = 0;
                                    unsigned long shift = 0;
                                    for(unsigned long i = 0; i < O3DGC_BINARY_STREAM_NUM_SYMBOLS_UINT32; ++i)
                                    {
                                        value  += (m_stream[position++] << shift);
                                        shift  += O3DGC_BINARY_STREAM_BITS_PER_SYMBOL0;
                                    }
                                    return value;
                                }